

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.h
# Opt level: O2

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseFalse<0u,rapidjson::BasicIStreamWrapper<std::istream>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  size_t sVar1;
  Ch *pCVar2;
  bool bVar3;
  char *pcVar4;
  undefined4 uVar5;
  
  BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take(is);
  pcVar4 = is->current_;
  uVar5 = 3;
  if (*pcVar4 == 'a') {
    BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take(is);
    pcVar4 = is->current_;
    if (*pcVar4 == 'l') {
      BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take(is);
      pcVar4 = is->current_;
      if (*pcVar4 == 's') {
        BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take(is);
        pcVar4 = is->current_;
        if (*pcVar4 == 'e') {
          BasicIStreamWrapper<std::basic_istream<char,_std::char_traits<char>_>_>::Take(is);
          bVar3 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                  ::Bool(handler,false);
          if (bVar3) {
            return;
          }
          pcVar4 = is->current_;
          uVar5 = 0x10;
        }
      }
    }
  }
  sVar1 = is->count_;
  pCVar2 = is->buffer_;
  *(undefined4 *)(this + 0x30) = uVar5;
  *(char **)(this + 0x38) = pcVar4 + (sVar1 - (long)pCVar2);
  return;
}

Assistant:

void ParseFalse(InputStream& is, Handler& handler) {
        RAPIDJSON_ASSERT(is.Peek() == 'f');
        is.Take();

        if (RAPIDJSON_LIKELY(Consume(is, 'a') && Consume(is, 'l') && Consume(is, 's') && Consume(is, 'e'))) {
            if (RAPIDJSON_UNLIKELY(!handler.Bool(false)))
                RAPIDJSON_PARSE_ERROR(kParseErrorTermination, is.Tell());
        }
        else
            RAPIDJSON_PARSE_ERROR(kParseErrorValueInvalid, is.Tell());
    }